

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

int lj_opt_fwd_tptr(jit_State *J,IRRef lim)

{
  short sVar1;
  ushort uVar2;
  AliasRet AVar3;
  short *psVar4;
  uint in_ESI;
  long in_RDI;
  IRIns *newref;
  jit_State *in_stack_00000008;
  IRRef ref;
  IRRef ta;
  uint local_1c;
  
  sVar1 = *(short *)(in_RDI + 0x98);
  uVar2 = *(ushort *)(in_RDI + 0x1b6);
  while( true ) {
    local_1c = (uint)uVar2;
    if (local_1c <= in_ESI) {
      return 1;
    }
    psVar4 = (short *)(*(long *)(in_RDI + 0x10) + (ulong)local_1c * 8);
    if ((sVar1 == *psVar4) ||
       (AVar3 = aa_table(in_stack_00000008,newref._4_4_,(IRRef)newref), AVar3 != ALIAS_NO)) break;
    uVar2 = psVar4[3];
  }
  return 0;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_tptr(jit_State *J, IRRef lim)
{
  IRRef ta = fins->op1;
  IRRef ref = J->chain[IR_NEWREF];
  while (ref > lim) {
    IRIns *newref = IR(ref);
    if (ta == newref->op1 || aa_table(J, ta, newref->op1) != ALIAS_NO)
      return 0;  /* Conflict. */
    ref = newref->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}